

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O1

void ncnn::resize_bilinear_c4
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  short *psVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  short *psVar13;
  short *psVar14;
  short *rows0p;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  uint uVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  Mat local_c8;
  Mat local_78;
  
  uVar2 = (ulong)(uint)w;
  iVar6 = (h + w) * 2;
  uVar18 = 0xffffffffffffffff;
  if (-1 < iVar6) {
    uVar18 = (long)iVar6 * 4;
  }
  pvVar7 = operator_new__(uVar18);
  lVar11 = (long)w;
  lVar12 = (long)h;
  if (0 < w) {
    uVar18 = 0;
    do {
      fVar4 = ((float)(int)uVar18 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
      fVar21 = floorf(fVar4);
      iVar5 = (int)fVar21;
      fVar24 = 0.0;
      iVar6 = iVar5;
      if (iVar5 < 1) {
        iVar6 = 0;
      }
      if (-1 < iVar5) {
        fVar24 = (fVar4 - (float)(int)fVar21) * 2048.0;
      }
      if (srcw + -1 <= iVar6) {
        fVar24 = 2048.0;
        iVar6 = srcw + -2;
      }
      *(int *)((long)pvVar7 + uVar18 * 4) = iVar6 << 2;
      uVar20 = -(uint)(0.0 <= 2048.0 - fVar24);
      auVar22._0_4_ = (int)((float)(uVar20 & 0x3f000000 | ~uVar20 & 0xbf000000) + (2048.0 - fVar24))
      ;
      auVar22._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar24) & 0x3f000000 | ~-(uint)(0.0 <= fVar24) & 0xbf000000)
                + fVar24);
      auVar22._8_8_ = 0;
      auVar22 = packssdw(auVar22,auVar22);
      *(int *)((long)pvVar7 + uVar18 * 4 + lVar12 * 4 + lVar11 * 4) = auVar22._0_4_;
      uVar18 = uVar18 + 1;
    } while (uVar2 != uVar18);
  }
  psVar13 = (short *)((long)pvVar7 + lVar12 * 4 + lVar11 * 8);
  if (0 < h) {
    uVar18 = 0;
    do {
      fVar4 = ((float)(int)uVar18 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
      fVar21 = floorf(fVar4);
      iVar6 = (int)fVar21;
      fVar24 = 0.0;
      bVar19 = -1 < iVar6;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (bVar19) {
        fVar24 = (fVar4 - (float)(int)fVar21) * 2048.0;
      }
      iVar5 = iVar6;
      if (srch + -1 <= iVar6) {
        iVar5 = srch + -2;
      }
      *(int *)((long)pvVar7 + uVar18 * 4 + lVar11 * 4) = iVar5;
      if (srch + -1 <= iVar6) {
        fVar24 = 2048.0;
      }
      uVar20 = -(uint)(0.0 <= 2048.0 - fVar24);
      auVar23._0_4_ = (int)((float)(uVar20 & 0x3f000000 | ~uVar20 & 0xbf000000) + (2048.0 - fVar24))
      ;
      auVar23._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar24) & 0x3f000000 | ~-(uint)(0.0 <= fVar24) & 0xbf000000)
                + fVar24);
      auVar23._8_8_ = 0;
      auVar22 = packssdw(auVar23,auVar23);
      *(int *)(psVar13 + uVar18 * 2) = auVar22._0_4_;
      uVar18 = uVar18 + 1;
    } while ((uint)h != uVar18);
  }
  iVar6 = w * 4;
  local_c8.cstep = 0;
  local_c8.data = (short *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,iVar6,2,(Allocator *)0x0);
  local_78.cstep = 0;
  local_78.data = (short *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,iVar6,2,(Allocator *)0x0);
  if (0 < h) {
    lVar12 = lVar12 * 4 + lVar11 * 4;
    iVar5 = 0;
    psVar8 = (short *)local_78.data;
    psVar14 = (short *)local_c8.data;
    iVar10 = -2;
    do {
      iVar1 = *(int *)((long)pvVar7 + (long)iVar5 * 4 + lVar11 * 4);
      rows0p = psVar14;
      if (iVar1 != iVar10) {
        if (iVar1 == iVar10 + 1) {
          rows0p = psVar8;
          psVar8 = psVar14;
          if (0 < w) {
            iVar10 = (iVar1 + 1) * srcstride;
            uVar18 = 0;
            do {
              lVar9 = (long)*(int *)((long)pvVar7 + uVar18 * 4);
              iVar16 = (int)*(short *)((long)pvVar7 + uVar18 * 4 + lVar12);
              iVar15 = (int)*(short *)((long)pvVar7 + uVar18 * 4 + lVar12 + 2);
              psVar14[uVar18 * 4] =
                   (short)((uint)src[lVar9 + (long)iVar10 + 4] * iVar15 +
                           (uint)src[lVar9 + iVar10] * iVar16 >> 4);
              psVar14[uVar18 * 4 + 1] =
                   (short)((uint)src[lVar9 + (long)iVar10 + 5] * iVar15 +
                           (uint)src[lVar9 + (long)iVar10 + 1] * iVar16 >> 4);
              psVar14[uVar18 * 4 + 2] =
                   (short)((uint)src[lVar9 + (long)iVar10 + 6] * iVar15 +
                           (uint)src[lVar9 + (long)iVar10 + 2] * iVar16 >> 4);
              psVar14[uVar18 * 4 + 3] =
                   (short)((uint)src[lVar9 + (long)iVar10 + 7] * iVar15 +
                           (uint)src[lVar9 + (long)iVar10 + 3] * iVar16 >> 4);
              uVar18 = uVar18 + 1;
            } while (uVar2 != uVar18);
          }
        }
        else if (0 < w) {
          iVar10 = iVar1 * srcstride;
          iVar15 = (iVar1 + 1) * srcstride;
          uVar18 = 0;
          do {
            lVar9 = (long)*(int *)((long)pvVar7 + uVar18 * 4);
            iVar17 = (int)*(short *)((long)pvVar7 + uVar18 * 4 + lVar12);
            iVar16 = (int)*(short *)((long)pvVar7 + uVar18 * 4 + lVar12 + 2);
            psVar14[uVar18 * 4] =
                 (short)((uint)src[lVar9 + (long)iVar10 + 4] * iVar16 +
                         (uint)src[lVar9 + iVar10] * iVar17 >> 4);
            psVar14[uVar18 * 4 + 1] =
                 (short)((uint)src[lVar9 + (long)iVar10 + 5] * iVar16 +
                         (uint)src[lVar9 + (long)iVar10 + 1] * iVar17 >> 4);
            psVar14[uVar18 * 4 + 2] =
                 (short)((uint)src[lVar9 + (long)iVar10 + 6] * iVar16 +
                         (uint)src[lVar9 + (long)iVar10 + 2] * iVar17 >> 4);
            psVar14[uVar18 * 4 + 3] =
                 (short)((uint)src[lVar9 + (long)iVar10 + 7] * iVar16 +
                         (uint)src[lVar9 + (long)iVar10 + 3] * iVar17 >> 4);
            psVar8[uVar18 * 4] =
                 (short)((uint)src[lVar9 + (long)iVar15 + 4] * iVar16 +
                         (uint)src[lVar9 + iVar15] * iVar17 >> 4);
            psVar8[uVar18 * 4 + 1] =
                 (short)((uint)src[lVar9 + (long)iVar15 + 5] * iVar16 +
                         (uint)src[lVar9 + (long)iVar15 + 1] * iVar17 >> 4);
            psVar8[uVar18 * 4 + 2] =
                 (short)((uint)src[lVar9 + (long)iVar15 + 6] * iVar16 +
                         (uint)src[lVar9 + (long)iVar15 + 2] * iVar17 >> 4);
            psVar8[uVar18 * 4 + 3] =
                 (short)((uint)src[lVar9 + (long)iVar15 + 7] * iVar16 +
                         (uint)src[lVar9 + (long)iVar15 + 3] * iVar17 >> 4);
            uVar18 = uVar18 + 1;
          } while (uVar2 != uVar18);
        }
      }
      iVar10 = iVar5 + 1;
      if ((iVar10 < h) && (*(int *)((long)pvVar7 + (long)iVar10 * 4 + lVar11 * 4) == iVar1)) {
        vresize_two(rows0p,psVar8,iVar6,dst + iVar5 * stride,dst + iVar10 * stride,*psVar13,
                    psVar13[1],psVar13[2],psVar13[3]);
        lVar9 = 8;
        iVar5 = iVar10;
      }
      else {
        vresize_one(rows0p,psVar8,iVar6,dst + iVar5 * stride,*psVar13,psVar13[1]);
        lVar9 = 4;
      }
      psVar13 = (short *)((long)psVar13 + lVar9);
      iVar5 = iVar5 + 1;
      psVar14 = rows0p;
      iVar10 = iVar1;
    } while (iVar5 < h);
  }
  operator_delete__(pvVar7);
  piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((short *)local_78.data != (short *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((short *)local_c8.data != (short *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear_c4(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx * 4;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w * 4, (size_t)2u);
    Mat rowsbuf1(w * 4, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S1 = vld1_u8(S1p);
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S1high = vget_high_s16(_S116);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows1p[0] = (S1p[0] * a0 + S1p[4] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[5] * a1) >> 4;
                rows1p[2] = (S1p[2] * a0 + S1p[6] * a1) >> 4;
                rows1p[3] = (S1p[3] * a0 + S1p[7] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 4;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = src + srcstride * (sy);
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = vld1_u8(S0p);
                uint8x8_t _S1 = vld1_u8(S1p);
                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0low = vget_low_s16(_S016);
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S0high = vget_high_s16(_S016);
                int16x4_t _S1high = vget_high_s16(_S116);
                int32x4_t _rows0 = vmull_s16(_S0low, _a0);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows0 = vmlal_s16(_rows0, _S0high, _a1);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows0_sr4 = vshrn_n_s32(_rows0, 4);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows0p, _rows0_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0] * a0 + S0p[4] * a1) >> 4;
                rows0p[1] = (S0p[1] * a0 + S0p[5] * a1) >> 4;
                rows0p[2] = (S0p[2] * a0 + S0p[6] * a1) >> 4;
                rows0p[3] = (S0p[3] * a0 + S0p[7] * a1) >> 4;
                rows1p[0] = (S1p[0] * a0 + S1p[4] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[5] * a1) >> 4;
                rows1p[2] = (S1p[2] * a0 + S1p[6] * a1) >> 4;
                rows1p[3] = (S1p[3] * a0 + S1p[7] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 4;
                rows1p += 4;
            }
        }

        prev_sy1 = sy;

        if (dy + 1 < h && yofs[dy + 1] == sy)
        {
            // vresize for two rows
            unsigned char* Dp0 = dst + stride * dy;
            unsigned char* Dp1 = dst + stride * (dy + 1);

            vresize_two(rows0, rows1, w * 4, Dp0, Dp1, ibeta[0], ibeta[1], ibeta[2], ibeta[3]);

            ibeta += 4;
            dy += 1;
        }
        else
        {
            // vresize
            unsigned char* Dp = dst + stride * dy;

            vresize_one(rows0, rows1, w * 4, Dp, ibeta[0], ibeta[1]);

            ibeta += 2;
        }
    }

    delete[] buf;
}